

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdFreePsbtPubkeyList(void *handle,void *pubkey_list_handle)

{
  void *pvVar1;
  long in_RSI;
  string *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  CfdCapiPsbtPubkeyListHandle *list_handle;
  int result;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_ffffffffffffff40;
  allocator local_81;
  string local_80 [4];
  uint32_t in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  long local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"PsbtPubkeyList",&local_51);
    cfd::capi::CheckBuffer(except,in_stack_00000038);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (*(long *)(local_18 + 0x18) != 0) {
      pvVar1 = *(void **)(local_18 + 0x18);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  (in_stack_ffffffffffffff40);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_18 + 0x18) = 0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"PsbtPubkeyList",&local_81);
    cfd::capi::FreeBuffer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return 0;
}

Assistant:

int CfdFreePsbtPubkeyList(void* handle, void* pubkey_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (pubkey_list_handle != nullptr) {
      CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
      CfdCapiPsbtPubkeyListHandle* list_handle =
          static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
      if (list_handle->key_list != nullptr) {
        delete list_handle->key_list;
        list_handle->key_list = nullptr;
      }
      FreeBuffer(
          pubkey_list_handle, kPrefixPsbtPubkeyList,
          sizeof(CfdCapiPsbtPubkeyListHandle));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}